

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O0

void __thiscall
Assimp::MMDImporter::InternReadFile
          (MMDImporter *this,string *file,aiScene *pScene,IOSystem *param_3)

{
  long lVar1;
  DeadlyImportError *pDVar2;
  undefined1 local_3f8 [8];
  PmxModel model;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  fpos local_2a0 [16];
  ulong local_290;
  size_t fileSize;
  istream fileStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_118 [8];
  filebuf fb;
  IOSystem *param_3_local;
  aiScene *pScene_local;
  string *file_local;
  MMDImporter *this_local;
  
  std::filebuf::filebuf(local_118);
  std::operator|(_S_in,_S_bin);
  lVar1 = std::filebuf::open(local_118,(_Ios_Openmode)file);
  if (lVar1 == 0) {
    pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_168,"Failed to open file ",file);
    std::operator+(&local_148,&local_168,".");
    DeadlyImportError::DeadlyImportError(pDVar2,&local_148);
    __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::istream::istream(&fileSize,(streambuf *)local_118);
  std::istream::seekg((long)&fileSize,_S_beg);
  local_2a0 = (fpos  [16])std::istream::tellg();
  local_290 = std::fpos::operator_cast_to_long(local_2a0);
  std::istream::seekg((long)&fileSize,_S_beg);
  if (local_290 < 0x130) {
    model.soft_bodies._M_t.
    super___uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxSoftBody_*,_std::default_delete<pmx::PmxSoftBody[]>_>.
    super__Head_base<0UL,_pmx::PmxSoftBody_*,_false>._M_head_impl._7_1_ = 1;
    pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_2c0,file," is too small.");
    DeadlyImportError::DeadlyImportError(pDVar2,&local_2c0);
    model.soft_bodies._M_t.
    super___uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxSoftBody_*,_std::default_delete<pmx::PmxSoftBody[]>_>.
    super__Head_base<0UL,_pmx::PmxSoftBody_*,_false>._M_head_impl._7_1_ = 0;
    __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pmx::PmxModel::PmxModel((PmxModel *)local_3f8);
  pmx::PmxModel::Read((PmxModel *)local_3f8,(istream *)&fileSize);
  CreateDataFromImport(this,(PmxModel *)local_3f8,pScene);
  pmx::PmxModel::~PmxModel((PmxModel *)local_3f8);
  std::istream::~istream(&fileSize);
  std::filebuf::~filebuf(local_118);
  return;
}

Assistant:

void MMDImporter::InternReadFile(const std::string &file, aiScene *pScene,
                                 IOSystem * /*pIOHandler*/) {
  // Read file by istream
  std::filebuf fb;
  if (!fb.open(file, std::ios::in | std::ios::binary)) {
    throw DeadlyImportError("Failed to open file " + file + ".");
  }

  std::istream fileStream(&fb);

  // Get the file-size and validate it, throwing an exception when fails
  fileStream.seekg(0, fileStream.end);
  size_t fileSize = static_cast<size_t>(fileStream.tellg());
  fileStream.seekg(0, fileStream.beg);

  if (fileSize < sizeof(pmx::PmxModel)) {
    throw DeadlyImportError(file + " is too small.");
  }

  pmx::PmxModel model;
  model.Read(&fileStream);

  CreateDataFromImport(&model, pScene);
}